

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O1

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::operator*=(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,double s)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  if (0 < image->depth) {
    lVar1 = 0;
    do {
      if (0 < image->height) {
        lVar2 = 0;
        do {
          if (0 < image->width) {
            lVar3 = 0;
            do {
              iVar4 = (int)((double)image->img[lVar1][lVar2][lVar3] * s);
              if (0xfe < iVar4) {
                iVar4 = 0xff;
              }
              if (iVar4 < 1) {
                iVar4 = 0;
              }
              image->img[lVar1][lVar2][lVar3] = (uchar)iVar4;
              lVar3 = lVar3 + 1;
            } while (lVar3 < image->width);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < image->height);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < image->depth);
  }
  return image;
}

Assistant:

Image<T> &operator*=(Image<T> &image, double s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, static_cast<typename Image<T>::work_t>(v*s));
        }
      }
    }
  }

  return image;
}